

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

unsigned_long hash(XML_Parser parser,KEY s)

{
  size_t len;
  uint64_t uVar1;
  undefined1 local_60 [8];
  sipkey key;
  siphash state;
  KEY s_local;
  XML_Parser parser_local;
  
  copy_salt_to_sipkey(parser,(sipkey *)local_60);
  sip24_init((siphash *)(key.k + 1),(sipkey *)local_60);
  len = keylen(s);
  sip24_update((siphash *)(key.k + 1),s,len);
  uVar1 = sip24_final((siphash *)(key.k + 1));
  return uVar1;
}

Assistant:

static unsigned long FASTCALL
hash(XML_Parser parser, KEY s)
{
  struct siphash state;
  struct sipkey key;
  (void)sip_tobin;
  (void)sip24_valid;
  copy_salt_to_sipkey(parser, &key);
  sip24_init(&state, &key);
  sip24_update(&state, s, keylen(s) * sizeof(XML_Char));
  return (unsigned long)sip24_final(&state);
}